

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O0

void EnumerateGrids(size_t first_grid_idx,size_t count,void *index,void *table,
                   _func_void_char_ptr *callback)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  anon_class_24_3_8aa9199d skipping_callback;
  char pattern [82];
  size_t limit;
  size_t remaining;
  uint16_t pattern_count;
  size_t to_skip;
  uint16_t indexed_grid_offset;
  uint32_t current_pattern_idx;
  size_t indexed_grid_idx;
  char *in_stack_ffffffffffffff18;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  ulong *puzzle;
  char local_b8 [96];
  _func_void_char_ptr_void_ptr *local_58;
  long local_50;
  ushort local_42;
  ulong local_40;
  ushort local_36;
  uint local_34;
  ulong local_30;
  long local_20;
  
  local_30 = in_RDI & 0xfffffffffff00000;
  local_34 = *(uint *)(in_RDX + (in_RDI >> 0x14) * 6);
  local_36 = *(ushort *)(in_RDX + 4 + (in_RDI >> 0x14) * 6);
  local_40 = (ulong)local_36 + (in_RDI - local_30);
  local_42 = *(ushort *)(in_RCX + (ulong)local_34 * 2);
  while (local_50 = in_RSI, local_20 = in_RCX, local_42 <= local_40) {
    local_40 = local_40 - local_42;
    local_34 = local_34 + 1;
    local_42 = *(ushort *)(in_RCX + (ulong)local_34 * 2);
  }
  while (local_50 != 0) {
    local_58 = (_func_void_char_ptr_void_ptr *)(local_40 + local_50);
    if ((_func_void_char_ptr_void_ptr *)(ulong)local_42 < local_58) {
      local_58 = (_func_void_char_ptr_void_ptr *)(ulong)local_42;
    }
    GetPattern((int)((ulong)in_stack_ffffffffffffff20 >> 0x20),in_stack_ffffffffffffff18);
    puzzle = &local_40;
    in_stack_ffffffffffffff18 = local_b8;
    in_stack_ffffffffffffff20 = local_58;
    EnumerateGrids::$_0::operator_cast_to_function_pointer((__0 *)&stack0xffffffffffffff2f);
    TdokuEnumerate((char *)puzzle,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
    local_34 = local_34 + 1;
    local_42 = *(ushort *)(local_20 + (ulong)local_34 * 2);
  }
  return;
}

Assistant:

void EnumerateGrids(size_t first_grid_idx, size_t count,
                    const void *index, const void *table,
                    void (*callback)(const char *)) {
    size_t indexed_grid_idx = first_grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (first_grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (first_grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (first_grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    size_t remaining = count;
    while (remaining > 0) {
        size_t limit = to_skip + remaining;
        if (limit > pattern_count) limit = pattern_count;

        char pattern[82];
        GetPattern(current_pattern_idx, pattern);

        auto skipping_callback=[&](const char *grid){
            if (to_skip > 0) {
                to_skip--;
            } else {
                callback(grid);
                remaining--;
            }
        };
        // pass a thunk since we can't pass a capturing lambda as a function pointer
        TdokuEnumerate(pattern, limit, [](const char *grid, void *thunked_callback) {
            (*static_cast<decltype(skipping_callback)*>(thunked_callback))(grid);
        }, &skipping_callback);

        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
}